

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

unsigned_short GGUFMeta::GKV<unsigned_short>::get_kv(gguf_context *ctx,int k)

{
  unsigned_short uVar1;
  int iVar2;
  runtime_error *this;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  string local_40;
  
  lVar6 = (long)k;
  iVar2 = gguf_get_kv_type(ctx,lVar6);
  if (iVar2 == 2) {
    uVar1 = gguf_get_val_u16(ctx,lVar6);
    return uVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar3 = gguf_get_key(ctx,lVar6);
  uVar4 = gguf_type_name(iVar2);
  uVar5 = gguf_type_name(2);
  format_abi_cxx11_(&local_40,"key %s has wrong type %s but expected type %s",uVar3,uVar4,uVar5);
  std::runtime_error::runtime_error(this,(string *)&local_40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }